

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode JsGetPropertyIdFromSymbol(JsValueRef symbol,JsPropertyIdRef *propertyId)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  JsrtContext *pJVar4;
  RecyclableObject *value;
  JavascriptSymbol *pJVar5;
  undefined4 *puVar6;
  JsErrorCode JVar7;
  AutoNestedHandledExceptionType local_58 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  undefined1 auStack_38 [8];
  TTDRecorder _actionEntryPopper;
  
  auStack_38 = (undefined1  [8])0x0;
  _actionEntryPopper.m_actionEvent = (EventLogEntry *)0x0;
  pJVar4 = JsrtContext::GetCurrent();
  JVar7 = JsErrorNoCurrentContext;
  if (pJVar4 == (JsrtContext *)0x0) goto LAB_00383bbe;
  scriptContext = (((pJVar4->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr
  ;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_58,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (scriptContext->TTDShouldPerformRecordAction == true) {
    TTD::EventLog::RecordJsRTGetPropertyIdFromSymbol
              (scriptContext->threadContext->TTDLog,(TTDJsRTActionResultAutoRecorder *)auStack_38,
               symbol);
  }
  if (symbol == (JsValueRef)0x0) {
    JVar7 = JsErrorInvalidArgument;
  }
  else {
    if ((ulong)symbol >> 0x30 == 0) {
      value = Js::VarTo<Js::RecyclableObject>(symbol);
      pSVar1 = (((((value->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != scriptContext) {
        JVar7 = JsErrorWrongRuntime;
        if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_00383b4b;
        symbol = Js::CrossSite::MarshalVar(scriptContext,value,false);
      }
    }
    if (propertyId == (JsPropertyIdRef *)0x0) {
      JVar7 = JsErrorNullArgument;
    }
    else {
      *propertyId = (JsPropertyIdRef)0x0;
      bVar3 = Js::VarIs<Js::JavascriptSymbol>(symbol);
      JVar7 = JsErrorPropertyNotSymbol;
      if (bVar3) {
        pJVar5 = Js::VarTo<Js::JavascriptSymbol>(symbol);
        *propertyId = (pJVar5->propertyRecordUsageCache).propertyRecord.ptr;
        JVar7 = JsNoError;
      }
    }
  }
LAB_00383b4b:
  if ((JVar7 - JsErrorNoCurrentContext < 2) || (JVar7 == JsErrorFatal)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                       ,0x11f,
                       "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && (scriptExceptionAllowed || errCode != JsErrorScriptException) && errCode != JsErrorScriptTerminated)"
                       ,
                       "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && (scriptExceptionAllowed || errCode != JsErrorScriptException) && errCode != JsErrorScriptTerminated"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_58);
LAB_00383bbe:
  if (auStack_38 != (undefined1  [8])0x0) {
    if (*(int32 *)((long)auStack_38 + 4) != -1) {
      TTDAbort_unrecoverable_error("Hmm this got changed somewhere???");
    }
    *(JsErrorCode *)((long)auStack_38 + 4) = JVar7;
  }
  return JVar7;
}

Assistant:

CHAKRA_API JsGetPropertyIdFromSymbol(_In_ JsValueRef symbol, _Out_ JsPropertyIdRef *propertyId)
{
    return ContextAPINoScriptWrapper([&](Js::ScriptContext * scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTGetPropertyIdFromSymbol, symbol);

        VALIDATE_INCOMING_REFERENCE(symbol, scriptContext);
        PARAM_NOT_NULL(propertyId);
        *propertyId = nullptr;

        if (!Js::VarIs<Js::JavascriptSymbol>(symbol))
        {
            return JsErrorPropertyNotSymbol;
        }

        *propertyId = (JsPropertyIdRef)Js::VarTo<Js::JavascriptSymbol>(symbol)->GetValue();
        return JsNoError;
    },
    /*allowInObjectBeforeCollectCallback*/true);
}